

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::DenselySampledSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DenselySampledSpectrum *this)

{
  int *args;
  ulong uVar1;
  int *in_R8;
  long lVar2;
  string local_50;
  
  args = &this->lambda_max;
  StringPrintf<int_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ DenselySampledSpectrum lambda_min: %d lambda_max: %d values: [ ",
             (char *)this,args,in_R8);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (this->values).nStored; uVar1 = uVar1 + 1) {
    StringPrintf<float_const&>
              (&local_50,(pbrt *)0x3d67f6,(char *)((long)(this->values).ptr + lVar2),(float *)args);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 4;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string DenselySampledSpectrum::ToString() const {
    std::string s = StringPrintf("[ DenselySampledSpectrum lambda_min: %d lambda_max: %d "
                                 "values: [ ",
                                 lambda_min, lambda_max);
    for (int i = 0; i < values.size(); ++i)
        s += StringPrintf("%f ", values[i]);
    s += "] ]";
    return s;
}